

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_Get_Kerning(FT_Face face,FT_UInt left_glyph,FT_UInt right_glyph,FT_UInt kern_mode,
                       FT_Vector *akerning)

{
  FT_Driver pFVar1;
  FT_Long FVar2;
  FT_Long FVar3;
  FT_Pos orig_y;
  FT_Pos orig_x;
  FT_Driver driver;
  FT_Error error;
  FT_Vector *akerning_local;
  FT_UInt kern_mode_local;
  FT_UInt right_glyph_local;
  FT_UInt left_glyph_local;
  FT_Face face_local;
  
  driver._4_4_ = 0;
  if (face == (FT_Face)0x0) {
    face_local._4_4_ = 0x23;
  }
  else if (akerning == (FT_Vector *)0x0) {
    face_local._4_4_ = 6;
  }
  else {
    pFVar1 = face->driver;
    akerning->x = 0;
    akerning->y = 0;
    if (((pFVar1->clazz->get_kerning != (FT_Face_GetKerningFunc)0x0) &&
        (driver._4_4_ = (*pFVar1->clazz->get_kerning)(face,left_glyph,right_glyph,akerning),
        driver._4_4_ == 0)) && (kern_mode != 2)) {
      FVar2 = FT_MulFix(akerning->x,(face->size->metrics).x_scale);
      akerning->x = FVar2;
      FVar2 = FT_MulFix(akerning->y,(face->size->metrics).y_scale);
      akerning->y = FVar2;
      if (kern_mode != 1) {
        FVar2 = akerning->y;
        if ((face->size->metrics).x_ppem < 0x19) {
          FVar3 = FT_MulDiv(akerning->x,(ulong)(face->size->metrics).x_ppem,0x19);
          akerning->x = FVar3;
        }
        if ((face->size->metrics).y_ppem < 0x19) {
          FVar2 = FT_MulDiv(FVar2,(ulong)(face->size->metrics).y_ppem,0x19);
          akerning->y = FVar2;
        }
        akerning->x = akerning->x + 0x20U & 0xffffffffffffffc0;
        akerning->y = akerning->y + 0x20U & 0xffffffffffffffc0;
      }
    }
    face_local._4_4_ = driver._4_4_;
  }
  return face_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Get_Kerning( FT_Face     face,
                  FT_UInt     left_glyph,
                  FT_UInt     right_glyph,
                  FT_UInt     kern_mode,
                  FT_Vector  *akerning )
  {
    FT_Error   error = FT_Err_Ok;
    FT_Driver  driver;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    if ( !akerning )
      return FT_THROW( Invalid_Argument );

    driver = face->driver;

    akerning->x = 0;
    akerning->y = 0;

    if ( driver->clazz->get_kerning )
    {
      error = driver->clazz->get_kerning( face,
                                          left_glyph,
                                          right_glyph,
                                          akerning );
      if ( !error )
      {
        if ( kern_mode != FT_KERNING_UNSCALED )
        {
          akerning->x = FT_MulFix( akerning->x, face->size->metrics.x_scale );
          akerning->y = FT_MulFix( akerning->y, face->size->metrics.y_scale );

          if ( kern_mode != FT_KERNING_UNFITTED )
          {
            FT_Pos  orig_x = akerning->x;
            FT_Pos  orig_y = akerning->y;


            /* we scale down kerning values for small ppem values */
            /* to avoid that rounding makes them too big.         */
            /* `25' has been determined heuristically.            */
            if ( face->size->metrics.x_ppem < 25 )
              akerning->x = FT_MulDiv( orig_x,
                                       face->size->metrics.x_ppem, 25 );
            if ( face->size->metrics.y_ppem < 25 )
              akerning->y = FT_MulDiv( orig_y,
                                       face->size->metrics.y_ppem, 25 );

            akerning->x = FT_PIX_ROUND( akerning->x );
            akerning->y = FT_PIX_ROUND( akerning->y );

#ifdef FT_DEBUG_LEVEL_TRACE
            {
              FT_Pos  orig_x_rounded = FT_PIX_ROUND( orig_x );
              FT_Pos  orig_y_rounded = FT_PIX_ROUND( orig_y );


              if ( akerning->x != orig_x_rounded ||
                   akerning->y != orig_y_rounded )
                FT_TRACE5(( "FT_Get_Kerning: horizontal kerning"
                            " (%ld, %ld) scaled down to (%ld, %ld) pixels\n",
                            orig_x_rounded / 64, orig_y_rounded / 64,
                            akerning->x / 64, akerning->y / 64 ));
            }
#endif
          }
        }
      }
    }

    return error;
  }